

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDfs.c
# Opt level: O3

void Gia_ManCollectTest(Gia_Man_t *p)

{
  int iVar1;
  Vec_Int_t *vNodes;
  int *__ptr;
  Vec_Int_t *pVVar2;
  long lVar3;
  int level;
  long lVar4;
  int iNode;
  timespec ts;
  int local_3c;
  timespec local_38;
  
  iVar1 = clock_gettime(3,&local_38);
  if (iVar1 < 0) {
    lVar3 = 1;
  }
  else {
    lVar3 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_38.tv_nsec),8);
    lVar3 = ((lVar3 >> 7) - (lVar3 >> 0x3f)) + local_38.tv_sec * -1000000;
  }
  vNodes = (Vec_Int_t *)malloc(0x10);
  vNodes->nCap = 100;
  vNodes->nSize = 0;
  __ptr = (int *)malloc(400);
  vNodes->pArray = __ptr;
  Gia_ManIncrementTravId(p);
  pVVar2 = p->vCos;
  if (0 < pVVar2->nSize) {
    lVar4 = 0;
    do {
      iVar1 = pVVar2->pArray[lVar4];
      if ((iVar1 < 0) || (p->nObjs <= iVar1)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      local_3c = iVar1;
      Gia_ManCollectAnds(p,&local_3c,1,vNodes,(Vec_Int_t *)0x0);
      lVar4 = lVar4 + 1;
      pVVar2 = p->vCos;
    } while (lVar4 < pVVar2->nSize);
    __ptr = vNodes->pArray;
  }
  if (__ptr != (int *)0x0) {
    free(__ptr);
  }
  free(vNodes);
  Abc_Print((int)vNodes,"%s =","DFS from each output");
  level = 3;
  iVar1 = clock_gettime(3,&local_38);
  if (iVar1 < 0) {
    lVar4 = -1;
  }
  else {
    lVar4 = local_38.tv_nsec / 1000 + local_38.tv_sec * 1000000;
  }
  Abc_Print(level,"%9.2f sec\n",(double)(lVar4 + lVar3) / 1000000.0);
  return;
}

Assistant:

void Gia_ManCollectTest( Gia_Man_t * p )
{
    Vec_Int_t * vNodes;
    Gia_Obj_t * pObj;
    int i, iNode;
    abctime clk = Abc_Clock();
    vNodes = Vec_IntAlloc( 100 );
    Gia_ManIncrementTravId( p );
    Gia_ManForEachCo( p, pObj, i )
    {
        iNode = Gia_ObjId(p, pObj);
        Gia_ManCollectAnds( p, &iNode, 1, vNodes, NULL );
    }
    Vec_IntFree( vNodes );
    ABC_PRT( "DFS from each output", Abc_Clock() - clk );
}